

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_tpl.h
# Opt level: O1

uint32_t longest_match_slow_avx2(deflate_state *s,Pos cur_match)

{
  uchar *puVar1;
  ushort uVar2;
  uint uVar3;
  uchar *puVar4;
  Pos *pPVar5;
  long lVar6;
  undefined1 auVar7 [32];
  bool bVar8;
  uint uVar9;
  uint32_t uVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  undefined1 (*pauVar15) [32];
  undefined1 (*pauVar16) [32];
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  ulong uVar27;
  uchar *puVar28;
  uint local_c4;
  uint local_b0;
  uchar *local_90;
  uint local_84;
  uchar *local_78;
  ulong local_38;
  
  uVar17 = (ulong)cur_match;
  uVar13 = s->strstart;
  uVar3 = s->w_mask;
  puVar4 = s->window;
  puVar1 = puVar4 + uVar13;
  uVar24 = 2;
  if (s->prev_length != 0) {
    uVar24 = s->prev_length;
  }
  uVar14 = 0xffffffff;
  if (3 < uVar24) {
    uVar14 = (uint)(uVar24 < 8) << 2 | 0xfffffff9;
  }
  uVar19 = *(ulong *)(puVar1 + (uVar14 + uVar24));
  local_78 = puVar4 + (uVar14 + uVar24);
  uVar14 = s->lookahead;
  uVar23 = s->max_chain_length >> 2;
  if (uVar24 < s->good_match) {
    uVar23 = s->max_chain_length;
  }
  uVar9 = s->w_size - 0x106;
  uVar22 = 0;
  uVar20 = uVar13 - uVar9;
  if (uVar13 < uVar9 || uVar20 == 0) {
    uVar20 = 0;
  }
  pPVar5 = s->prev;
  lVar6 = *(long *)(puVar4 + uVar13);
  uVar9 = s->nice_match;
  local_c4 = uVar20;
  local_90 = puVar4;
  if (2 < uVar24) {
    uVar22 = 0;
    uVar10 = (*s->update_hash)(0,(uint32_t)puVar1[1]);
    uVar10 = (*s->update_hash)(uVar10,(uint32_t)puVar1[2]);
    uVar27 = 3;
    do {
      uVar10 = (*s->update_hash)(uVar10,(uint32_t)puVar1[uVar27]);
      if (s->head[uVar10] < (ushort)uVar17) {
        uVar22 = (ulong)((int)uVar27 - 2);
        uVar17 = (ulong)s->head[uVar10];
      }
      uVar25 = (int)uVar27 + 1;
      uVar27 = (ulong)uVar25;
    } while (uVar25 <= uVar24);
    local_c4 = (int)uVar22 + uVar20;
    if ((ushort)uVar17 <= (ushort)local_c4) goto LAB_00141843;
    local_78 = local_78 + -(uVar22 & 0xffff);
    local_90 = puVar4 + -(uVar22 & 0xffff);
  }
  local_84 = (uint)(uVar19 >> 0x10) & 0xffff;
  local_38 = uVar19 >> 0x20;
  do {
    if (uVar13 <= ((uint)uVar17 & 0xffff)) {
      return uVar24;
    }
    if (uVar24 < 4) {
      while ((uVar27 = uVar17 & 0xffff, *(short *)(local_78 + uVar27) != (short)uVar19 ||
             (*(short *)(local_90 + uVar27) != (short)lVar6))) {
        if (uVar23 == 1) {
          return uVar24;
        }
        uVar17 = (ulong)pPVar5[(uint)uVar27 & uVar3];
        uVar23 = uVar23 - 1;
        if (pPVar5[(uint)uVar27 & uVar3] <= (ushort)local_c4) {
          return uVar24;
        }
      }
    }
    else if (uVar24 < 8) {
      while ((uVar27 = uVar17 & 0xffff,
             *(uint *)(local_78 + uVar27) != (local_84 << 0x10 | (uint)(uVar19 & 0xffff)) ||
             (*(int *)(local_90 + uVar27) != (int)lVar6))) {
        if (uVar23 == 1) {
          return uVar24;
        }
        uVar17 = (ulong)pPVar5[(uint)uVar27 & uVar3];
        uVar23 = uVar23 - 1;
        if (pPVar5[(uint)uVar27 & uVar3] <= (ushort)local_c4) {
          return uVar24;
        }
      }
    }
    else {
      while ((uVar27 = uVar17 & 0xffff,
             *(ulong *)(local_78 + uVar27) !=
             (local_38 << 0x20 | uVar19 & 0xffff | (ulong)(local_84 << 0x10)) ||
             (*(long *)(local_90 + uVar27) != lVar6))) {
        if (uVar23 == 1) {
          return uVar24;
        }
        uVar17 = (ulong)pPVar5[(uint)uVar27 & uVar3];
        uVar23 = uVar23 - 1;
        if (pPVar5[(uint)uVar27 & uVar3] <= (ushort)local_c4) {
          return uVar24;
        }
      }
    }
    pauVar15 = (undefined1 (*) [32])(local_90 + (uVar17 & 0xffff) + 2);
    uVar25 = 0;
    pauVar16 = (undefined1 (*) [32])(puVar1 + 2);
    puVar28 = puVar1;
    do {
      auVar7 = vpcmpeqb_avx2(*pauVar16,*pauVar15);
      uVar21 = (uint)(SUB321(auVar7 >> 7,0) & 1) | (uint)(SUB321(auVar7 >> 0xf,0) & 1) << 1 |
               (uint)(SUB321(auVar7 >> 0x17,0) & 1) << 2 | (uint)(SUB321(auVar7 >> 0x1f,0) & 1) << 3
               | (uint)(SUB321(auVar7 >> 0x27,0) & 1) << 4 |
               (uint)(SUB321(auVar7 >> 0x2f,0) & 1) << 5 | (uint)(SUB321(auVar7 >> 0x37,0) & 1) << 6
               | (uint)(SUB321(auVar7 >> 0x3f,0) & 1) << 7 |
               (uint)(SUB321(auVar7 >> 0x47,0) & 1) << 8 | (uint)(SUB321(auVar7 >> 0x4f,0) & 1) << 9
               | (uint)(SUB321(auVar7 >> 0x57,0) & 1) << 10 |
               (uint)(SUB321(auVar7 >> 0x5f,0) & 1) << 0xb |
               (uint)(SUB321(auVar7 >> 0x67,0) & 1) << 0xc |
               (uint)(SUB321(auVar7 >> 0x6f,0) & 1) << 0xd |
               (uint)(SUB321(auVar7 >> 0x77,0) & 1) << 0xe | (uint)SUB321(auVar7 >> 0x7f,0) << 0xf |
               (uint)(SUB321(auVar7 >> 0x87,0) & 1) << 0x10 |
               (uint)(SUB321(auVar7 >> 0x8f,0) & 1) << 0x11 |
               (uint)(SUB321(auVar7 >> 0x97,0) & 1) << 0x12 |
               (uint)(SUB321(auVar7 >> 0x9f,0) & 1) << 0x13 |
               (uint)(SUB321(auVar7 >> 0xa7,0) & 1) << 0x14 |
               (uint)(SUB321(auVar7 >> 0xaf,0) & 1) << 0x15 |
               (uint)(SUB321(auVar7 >> 0xb7,0) & 1) << 0x16 | (uint)SUB321(auVar7 >> 0xbf,0) << 0x17
               | (uint)(SUB321(auVar7 >> 199,0) & 1) << 0x18 |
               (uint)(SUB321(auVar7 >> 0xcf,0) & 1) << 0x19 |
               (uint)(SUB321(auVar7 >> 0xd7,0) & 1) << 0x1a |
               (uint)(SUB321(auVar7 >> 0xdf,0) & 1) << 0x1b |
               (uint)(SUB321(auVar7 >> 0xe7,0) & 1) << 0x1c |
               (uint)(SUB321(auVar7 >> 0xef,0) & 1) << 0x1d |
               (uint)(SUB321(auVar7 >> 0xf7,0) & 1) << 0x1e |
               (uint)(byte)(auVar7[0x1f] >> 7) << 0x1f;
      if (uVar21 == 0xffffffff) {
        auVar7 = vpcmpeqb_avx2(pauVar16[1],pauVar15[1]);
        uVar21 = (uint)(SUB321(auVar7 >> 7,0) & 1) | (uint)(SUB321(auVar7 >> 0xf,0) & 1) << 1 |
                 (uint)(SUB321(auVar7 >> 0x17,0) & 1) << 2 |
                 (uint)(SUB321(auVar7 >> 0x1f,0) & 1) << 3 |
                 (uint)(SUB321(auVar7 >> 0x27,0) & 1) << 4 |
                 (uint)(SUB321(auVar7 >> 0x2f,0) & 1) << 5 |
                 (uint)(SUB321(auVar7 >> 0x37,0) & 1) << 6 |
                 (uint)(SUB321(auVar7 >> 0x3f,0) & 1) << 7 |
                 (uint)(SUB321(auVar7 >> 0x47,0) & 1) << 8 |
                 (uint)(SUB321(auVar7 >> 0x4f,0) & 1) << 9 |
                 (uint)(SUB321(auVar7 >> 0x57,0) & 1) << 10 |
                 (uint)(SUB321(auVar7 >> 0x5f,0) & 1) << 0xb |
                 (uint)(SUB321(auVar7 >> 0x67,0) & 1) << 0xc |
                 (uint)(SUB321(auVar7 >> 0x6f,0) & 1) << 0xd |
                 (uint)(SUB321(auVar7 >> 0x77,0) & 1) << 0xe | (uint)SUB321(auVar7 >> 0x7f,0) << 0xf
                 | (uint)(SUB321(auVar7 >> 0x87,0) & 1) << 0x10 |
                 (uint)(SUB321(auVar7 >> 0x8f,0) & 1) << 0x11 |
                 (uint)(SUB321(auVar7 >> 0x97,0) & 1) << 0x12 |
                 (uint)(SUB321(auVar7 >> 0x9f,0) & 1) << 0x13 |
                 (uint)(SUB321(auVar7 >> 0xa7,0) & 1) << 0x14 |
                 (uint)(SUB321(auVar7 >> 0xaf,0) & 1) << 0x15 |
                 (uint)(SUB321(auVar7 >> 0xb7,0) & 1) << 0x16 |
                 (uint)SUB321(auVar7 >> 0xbf,0) << 0x17 |
                 (uint)(SUB321(auVar7 >> 199,0) & 1) << 0x18 |
                 (uint)(SUB321(auVar7 >> 0xcf,0) & 1) << 0x19 |
                 (uint)(SUB321(auVar7 >> 0xd7,0) & 1) << 0x1a |
                 (uint)(SUB321(auVar7 >> 0xdf,0) & 1) << 0x1b |
                 (uint)(SUB321(auVar7 >> 0xe7,0) & 1) << 0x1c |
                 (uint)(SUB321(auVar7 >> 0xef,0) & 1) << 0x1d |
                 (uint)(SUB321(auVar7 >> 0xf7,0) & 1) << 0x1e |
                 (uint)(byte)(auVar7[0x1f] >> 7) << 0x1f;
        if (uVar21 == 0xffffffff) {
          pauVar16 = pauVar16 + 2;
          pauVar15 = pauVar15 + 2;
          uVar25 = uVar25 + 0x40;
          bVar8 = true;
        }
        else {
          pauVar16 = pauVar16 + 1;
          pauVar15 = pauVar15 + 1;
          uVar21 = ~uVar21;
          iVar26 = 0;
          if (uVar21 != 0) {
            for (; (uVar21 >> iVar26 & 1) == 0; iVar26 = iVar26 + 1) {
            }
          }
          puVar28 = (uchar *)(ulong)(iVar26 + uVar25 + 0x20);
          uVar25 = uVar25 + 0x20;
          bVar8 = false;
        }
      }
      else {
        uVar21 = ~uVar21;
        iVar26 = 0;
        if (uVar21 != 0) {
          for (; (uVar21 >> iVar26 & 1) == 0; iVar26 = iVar26 + 1) {
          }
        }
        puVar28 = (uchar *)(ulong)(iVar26 + uVar25);
        bVar8 = false;
      }
      iVar26 = (int)puVar28;
      if (!bVar8) goto LAB_00141539;
    } while (uVar25 < 0x100);
    iVar26 = 0x100;
LAB_00141539:
    uVar25 = iVar26 + 2;
    if (uVar24 < uVar25) {
      uVar11 = (int)(uVar17 & 0xffff) - ((uint)uVar22 & 0xffff);
      s->match_start = uVar11;
      iVar12 = 1;
      uVar21 = uVar14;
      if ((uVar14 < uVar25) || (uVar24 = uVar25, uVar21 = uVar25, uVar9 <= uVar25)) {
        local_b0 = uVar21;
        bVar8 = false;
      }
      else {
        uVar21 = iVar26 - 5;
        if (uVar25 < 8) {
          uVar21 = iVar26 - 1U;
        }
        if (uVar25 < 4) {
          uVar21 = iVar26 + 1;
        }
        uVar19 = *(ulong *)(puVar1 + uVar21);
        local_84 = (uint)(uVar19 >> 0x10) & 0xffff;
        local_38 = uVar19 >> 0x20;
        if ((uVar25 < 4) || (uVar13 <= uVar25 + uVar11)) {
          local_78 = local_90 + uVar21;
          iVar12 = 0;
          bVar8 = true;
        }
        else {
          uVar18 = 0;
          uVar17 = (ulong)uVar11;
          uVar22 = 0;
          do {
            uVar2 = pPVar5[(uVar11 & 0xffff) + uVar18 & uVar3];
            if (uVar2 < (ushort)uVar17) {
              if ((uint)uVar2 <= (uVar20 & 0xffff) + uVar18) {
                iVar12 = 5;
                uVar17 = (ulong)uVar11;
                goto LAB_0014181d;
              }
              uVar22 = (ulong)uVar18;
              uVar17 = (ulong)uVar2;
            }
            uVar18 = uVar18 + 1;
          } while (uVar18 <= iVar26 - 1U);
          uVar10 = (*s->update_hash)(0,(uint32_t)puVar1[(ulong)uVar25 - 4]);
          uVar10 = (*s->update_hash)(uVar10,(uint32_t)puVar1[(ulong)uVar25 - 3]);
          uVar10 = (*s->update_hash)(uVar10,(uint32_t)puVar1[(ulong)uVar25 - 2]);
          uVar2 = s->head[uVar10];
          if (uVar2 < (ushort)uVar17) {
            uVar22 = (ulong)(iVar26 - 2U);
            if ((iVar26 - 2U & 0xffff) + (uVar20 & 0xffff) < (uint)uVar2) {
              uVar17 = (ulong)uVar2;
              goto LAB_00141781;
            }
            iVar12 = 5;
          }
          else {
LAB_00141781:
            local_c4 = (int)uVar22 + uVar20;
            local_90 = puVar4 + -(uVar22 & 0xffff);
            local_78 = local_90 + uVar21;
            iVar12 = 7;
          }
LAB_0014181d:
          bVar8 = false;
        }
      }
      if (bVar8) goto LAB_0014164a;
    }
    else {
LAB_0014164a:
      uVar23 = uVar23 - 1;
      if (uVar23 == 0) {
        iVar12 = 1;
        local_b0 = uVar24;
      }
      else {
        uVar25 = (uint)uVar17;
        uVar17 = (ulong)pPVar5[uVar25 & 0xffff & uVar3];
        iVar12 = 7;
        if (pPVar5[uVar25 & 0xffff & uVar3] <= (ushort)local_c4) {
          iVar12 = 1;
          local_b0 = uVar24;
        }
      }
    }
  } while (iVar12 == 7);
  if (iVar12 != 5) {
    return local_b0;
  }
LAB_00141843:
  uVar13 = s->lookahead;
  if (uVar24 < s->lookahead) {
    uVar13 = uVar24;
  }
  return uVar13;
}

Assistant:

Z_INTERNAL uint32_t LONGEST_MATCH(deflate_state *const s, Pos cur_match) {
    unsigned int strstart = s->strstart;
    const unsigned wmask = s->w_mask;
    unsigned char *window = s->window;
    unsigned char *scan = window + strstart;
    Z_REGISTER unsigned char *mbase_start = window;
    Z_REGISTER unsigned char *mbase_end;
    const Pos *prev = s->prev;
    Pos limit;
#ifdef LONGEST_MATCH_SLOW
    Pos limit_base;
#else
    int32_t early_exit;
#endif
    uint32_t chain_length, nice_match, best_len, offset;
    uint32_t lookahead = s->lookahead;
    Pos match_offset = 0;
    uint64_t scan_start;
    uint64_t scan_end;

#define GOTO_NEXT_CHAIN \
    if (--chain_length && (cur_match = prev[cur_match & wmask]) > limit) \
        continue; \
    return best_len;

    /* The code is optimized for STD_MAX_MATCH-2 multiple of 16. */
    Assert(STD_MAX_MATCH == 258, "Code too clever");

    best_len = s->prev_length ? s->prev_length : STD_MIN_MATCH-1;

    /* Calculate read offset which should only extend an extra byte
     * to find the next best match length.
     */
    offset = best_len-1;
    if (best_len >= sizeof(uint32_t)) {
        offset -= 2;
        if (best_len >= sizeof(uint64_t))
            offset -= 4;
    }

    scan_start = zng_memread_8(scan);
    scan_end = zng_memread_8(scan+offset);
    mbase_end  = (mbase_start+offset);

    /* Do not waste too much time if we already have a good match */
    chain_length = s->max_chain_length;
    if (best_len >= s->good_match)
        chain_length >>= 2;
    nice_match = (uint32_t)s->nice_match;

    /* Stop when cur_match becomes <= limit. To simplify the code,
     * we prevent matches with the string of window index 0
     */
    limit = strstart > MAX_DIST(s) ? (Pos)(strstart - MAX_DIST(s)) : 0;
#ifdef LONGEST_MATCH_SLOW
    limit_base = limit;
    if (best_len >= STD_MIN_MATCH) {
        /* We're continuing search (lazy evaluation). */
        uint32_t i, hash;
        Pos pos;

        /* Find a most distant chain starting from scan with index=1 (index=0 corresponds
         * to cur_match). We cannot use s->prev[strstart+1,...] immediately, because
         * these strings are not yet inserted into the hash table.
         */
        hash = s->update_hash(0, scan[1]);
        hash = s->update_hash(hash, scan[2]);

        for (i = 3; i <= best_len; i++) {
            hash = s->update_hash(hash, scan[i]);

            /* If we're starting with best_len >= 3, we can use offset search. */
            pos = s->head[hash];
            if (pos < cur_match) {
                match_offset = (Pos)(i - 2);
                cur_match = pos;
            }
        }

        /* Update offset-dependent variables */
        limit = limit_base+match_offset;
        if (cur_match <= limit)
            goto break_matching;
        mbase_start -= match_offset;
        mbase_end -= match_offset;
    }
#else
    early_exit = s->level < EARLY_EXIT_TRIGGER_LEVEL;
#endif
    Assert((unsigned long)strstart <= s->window_size - MIN_LOOKAHEAD, "need lookahead");
    for (;;) {
        if (cur_match >= strstart)
            break;

        /* Skip to next match if the match length cannot increase or if the match length is
         * less than 2. Note that the checks below for insufficient lookahead only occur
         * occasionally for performance reasons.
         * Therefore uninitialized memory will be accessed and conditional jumps will be made
         * that depend on those values. However the length of the match is limited to the
         * lookahead, so the output of deflate is not affected by the uninitialized values.
         */
        if (best_len < sizeof(uint32_t)) {
            for (;;) {
                if (zng_memcmp_2(mbase_end+cur_match, &scan_end) == 0 &&
                    zng_memcmp_2(mbase_start+cur_match, &scan_start) == 0)
                    break;
                GOTO_NEXT_CHAIN;
            }
        } else if (best_len >= sizeof(uint64_t)) {
            for (;;) {
                if (zng_memcmp_8(mbase_end+cur_match, &scan_end) == 0 &&
                    zng_memcmp_8(mbase_start+cur_match, &scan_start) == 0)
                    break;
                GOTO_NEXT_CHAIN;
            }
        } else {
            for (;;) {
                if (zng_memcmp_4(mbase_end+cur_match, &scan_end) == 0 &&
                    zng_memcmp_4(mbase_start+cur_match, &scan_start) == 0)
                    break;
                GOTO_NEXT_CHAIN;
            }
        }
        uint32_t len = COMPARE256(scan+2, mbase_start+cur_match+2) + 2;
        Assert(scan+len <= window+(unsigned)(s->window_size-1), "wild scan");

        if (len > best_len) {
            uint32_t match_start = cur_match - match_offset;
            s->match_start = match_start;

            /* Do not look for matches beyond the end of the input. */
            if (len > lookahead)
                return lookahead;
            best_len = len;
            if (best_len >= nice_match)
                return best_len;

            offset = best_len-1;
            if (best_len >= sizeof(uint32_t)) {
                offset -= 2;
                if (best_len >= sizeof(uint64_t))
                    offset -= 4;
            }

            scan_end = zng_memread_8(scan+offset);

#ifdef LONGEST_MATCH_SLOW
            /* Look for a better string offset */
            if (UNLIKELY(len > STD_MIN_MATCH && match_start + len < strstart)) {
                Pos pos, next_pos;
                uint32_t i, hash;
                unsigned char *scan_endstr;

                /* Go back to offset 0 */
                cur_match -= match_offset;
                match_offset = 0;
                next_pos = cur_match;
                for (i = 0; i <= len - STD_MIN_MATCH; i++) {
                    pos = prev[(cur_match + i) & wmask];
                    if (pos < next_pos) {
                        /* Hash chain is more distant, use it */
                        if (pos <= limit_base + i)
                            goto break_matching;
                        next_pos = pos;
                        match_offset = (Pos)i;
                    }
                }
                /* Switch cur_match to next_pos chain */
                cur_match = next_pos;

                /* Try hash head at len-(STD_MIN_MATCH-1) position to see if we could get
                 * a better cur_match at the end of string. Using (STD_MIN_MATCH-1) lets
                 * us include one more byte into hash - the byte which will be checked
                 * in main loop now, and which allows to grow match by 1.
                 */
                scan_endstr = scan + len - (STD_MIN_MATCH+1);

                hash = s->update_hash(0, scan_endstr[0]);
                hash = s->update_hash(hash, scan_endstr[1]);
                hash = s->update_hash(hash, scan_endstr[2]);

                pos = s->head[hash];
                if (pos < cur_match) {
                    match_offset = (Pos)(len - (STD_MIN_MATCH+1));
                    if (pos <= limit_base + match_offset)
                        goto break_matching;
                    cur_match = pos;
                }

                /* Update offset-dependent variables */
                limit = limit_base+match_offset;
                mbase_start = window-match_offset;
                mbase_end = (mbase_start+offset);
                continue;
            }
#endif
            mbase_end = (mbase_start+offset);
        }
#ifndef LONGEST_MATCH_SLOW
        else if (UNLIKELY(early_exit)) {
            /* The probability of finding a match later if we here is pretty low, so for
             * performance it's best to outright stop here for the lower compression levels
             */
            break;
        }
#endif
        GOTO_NEXT_CHAIN;
    }
    return best_len;

#ifdef LONGEST_MATCH_SLOW
break_matching:

    if (best_len < s->lookahead)
        return best_len;

    return s->lookahead;
#endif
}